

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O0

Result __thiscall wabt::TypeChecker::PeekAndCheckType(TypeChecker *this,Index depth,Type expected)

{
  Result RVar1;
  Result rhs;
  Type TStack_2c;
  Result result;
  Type actual;
  Index depth_local;
  TypeChecker *this_local;
  Type expected_local;
  
  Type::Type(&stack0xffffffffffffffd4,Any);
  RVar1 = PeekType(this,depth,&stack0xffffffffffffffd4);
  rhs = CheckType(TStack_2c,expected);
  RVar1 = operator|(RVar1,rhs);
  return (Result)RVar1.enum_;
}

Assistant:

Result TypeChecker::PeekAndCheckType(Index depth, Type expected) {
  Type actual = Type::Any;
  Result result = PeekType(depth, &actual);
  return result | CheckType(actual, expected);
}